

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

uint8 * __thiscall
google::protobuf::MethodOptions::InternalSerializeWithCachedSizesToArray
          (MethodOptions *this,bool deterministic,uint8 *target)

{
  bool bVar1;
  int iVar2;
  void *pvVar3;
  byte *pbVar4;
  Type *this_00;
  uint8 *puVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  int index;
  
  uVar8 = (this->_has_bits_).has_bits_[0];
  if ((uVar8 & 1) != 0) {
    bVar1 = this->deprecated_;
    target[0] = 0x88;
    target[1] = '\x02';
    target[2] = bVar1;
    target = target + 3;
  }
  if ((uVar8 & 2) != 0) {
    uVar7 = (ulong)this->idempotency_level_;
    pbVar4 = target + 2;
    target[0] = 0x90;
    target[1] = 2;
    uVar9 = uVar7;
    if (0x7f < uVar7) {
      do {
        *pbVar4 = (byte)uVar7 | 0x80;
        uVar9 = uVar7 >> 7;
        pbVar4 = pbVar4 + 1;
        bVar1 = 0x3fff < uVar7;
        uVar7 = uVar9;
      } while (bVar1);
    }
    *pbVar4 = (byte)uVar9;
    target = pbVar4 + 1;
  }
  iVar2 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar2 != 0) {
    index = 0;
    do {
      this_00 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
                          (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,index);
      target[0] = 0xba;
      target[1] = 0x3e;
      pbVar4 = target + 2;
      uVar8 = this_00->_cached_size_;
      uVar6 = uVar8;
      if (0x7f < uVar8) {
        do {
          *pbVar4 = (byte)uVar8 | 0x80;
          uVar6 = uVar8 >> 7;
          pbVar4 = pbVar4 + 1;
          bVar1 = 0x3fff < uVar8;
          uVar8 = uVar6;
        } while (bVar1);
      }
      *pbVar4 = (byte)uVar6;
      target = UninterpretedOption::InternalSerializeWithCachedSizesToArray
                         (this_00,false,pbVar4 + 1);
      index = index + 1;
    } while (index != iVar2);
  }
  puVar5 = internal::ExtensionSet::InternalSerializeWithCachedSizesToArray
                     (&this->_extensions_,1000,0x20000000,deterministic,target);
  pvVar3 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    puVar5 = internal::WireFormat::SerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe),puVar5);
    return puVar5;
  }
  return puVar5;
}

Assistant:

::google::protobuf::uint8* MethodOptions::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.MethodOptions)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional bool deprecated = 33 [default = false];
  if (cached_has_bits & 0x00000001u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(33, this->deprecated(), target);
  }

  // optional .google.protobuf.MethodOptions.IdempotencyLevel idempotency_level = 34 [default = IDEMPOTENCY_UNKNOWN];
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      34, this->idempotency_level(), target);
  }

  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  for (unsigned int i = 0, n = this->uninterpreted_option_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        999, this->uninterpreted_option(i), deterministic, target);
  }

  // Extension range [1000, 536870912)
  target = _extensions_.InternalSerializeWithCachedSizesToArray(
      1000, 536870912, deterministic, target);

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.MethodOptions)
  return target;
}